

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::AddRegConstCommand::AddRegConstCommand
          (AddRegConstCommand *this,CTemp *leftOperand,int constant)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017cef0;
  std::__cxx11::string::string((string *)&this->leftOperand,(string *)leftOperand);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::AddRegConstCommand::AddRegConstCommand( const IRT::CTemp leftOperand, int constant ) : leftOperand(
        leftOperand ), constant( constant ) { }